

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_Respawn(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  byte *pbVar1;
  ulong uVar2;
  uint uVar3;
  ActorFlags6 AVar4;
  bool bVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  AActor *this;
  char *pcVar8;
  ulong uVar9;
  DVector3 local_58;
  DVector3 local_38;
  
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003e6129;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e6119:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e6129:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xef3,
                  "int AF_AActor_A_Respawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003e5f03;
    bVar5 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar5) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e6129;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003e6119;
LAB_003e5f03:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') {
LAB_003e5f2b:
      uVar3 = param[1].field_0.i;
      local_38.X = (this->__Pos).X;
      local_38.Y = (this->__Pos).Y;
      local_38.Z = (this->__Pos).Z;
      *(byte *)&(this->flags).Value = (byte)(this->flags).Value | 2;
      pAVar6 = AActor::GetDefault(this);
      this->Height = pAVar6->Height;
      pAVar6 = AActor::GetDefault(this);
      this->radius = pAVar6->radius;
      AActor::RestoreSpecialPosition(this);
      if ((uVar3 & 4) == 0) {
        local_58.X = (this->__Pos).X;
        local_58.Y = (this->__Pos).Y;
        bVar5 = P_CheckPosition(this,(DVector2 *)&local_58,true);
      }
      else {
        local_58.X = (this->__Pos).X;
        local_58.Y = (this->__Pos).Y;
        local_58.Z = (this->__Pos).Z;
        bVar5 = P_TeleportMove(this,&local_58,true,false);
      }
      if (bVar5 == false) {
        *(byte *)&(this->flags).Value = (byte)(this->flags).Value & 0xfd;
      }
      else {
        pAVar6 = AActor::GetDefault(this);
        this->health = pAVar6->health;
        obj = &this->target;
        if ((uVar3 & 2) == 0) {
          (obj->field_0).p = (AActor *)0x0;
          (this->lastenemy).field_0.p = (AActor *)0x0;
          (this->LastHeard).field_0.p = (AActor *)0x0;
        }
        else {
          pAVar7 = GC::ReadBarrier<AActor>((AActor **)obj);
          if (pAVar7 == this) {
            (obj->field_0).p = (AActor *)0x0;
          }
          pAVar7 = GC::ReadBarrier<AActor>((AActor **)&this->lastenemy);
          if (pAVar7 == this) {
            (this->lastenemy).field_0.p = (AActor *)0x0;
          }
        }
        (this->flags).Value = (this->flags).Value & 0x8000000 | (pAVar6->flags).Value & 0xf7ffffff;
        (this->flags2).Value = (pAVar6->flags2).Value;
        uVar9._0_4_ = pAVar6->flags3;
        uVar9._4_4_ = pAVar6->flags4;
        uVar2._0_4_ = this->flags3;
        uVar2._4_4_ = this->flags4;
        uVar9 = uVar2 & 0x180000080 | uVar9 & 0xfffffffe7fffff7f;
        this->flags3 = (ActorFlags3)(int)uVar9;
        this->flags4 = (ActorFlags4)(int)(uVar9 >> 0x20);
        AVar4.Value = (pAVar6->flags6).Value;
        this->flags5 = (ActorFlags5)(pAVar6->flags5).Value;
        this->flags6 = (ActorFlags6)AVar4.Value;
        (this->flags7).Value = (pAVar6->flags7).Value;
        AActor::SetState(this,this->SpawnState,false);
        pbVar1 = (byte *)((long)&(this->renderflags).Value + 1);
        *pbVar1 = *pbVar1 & 0x7f;
        if ((uVar3 & 1) != 0) {
          P_SpawnTeleportFog(this,&local_38,true,true);
          local_58.X = (this->__Pos).X;
          local_58.Y = (this->__Pos).Y;
          local_58.Z = (this->__Pos).Z;
          P_SpawnTeleportFog(this,&local_58,false,true);
        }
        if (((this->flags).Value & 0x8400000) == 0x400000) {
          level.total_monsters = level.total_monsters + 1;
        }
      }
      return 0;
    }
    pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') goto LAB_003e5f2b;
    pcVar8 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xef4,"int AF_AActor_A_Respawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Respawn)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(flags);

	bool oktorespawn = false;
	DVector3 pos = self->Pos();

	self->flags |= MF_SOLID;
	self->Height = self->GetDefault()->Height;
	self->radius = self->GetDefault()->radius;
	self->RestoreSpecialPosition();

	if (flags & RSF_TELEFRAG)
	{
		// [KS] DIE DIE DIE DIE erm *ahem* =)
		oktorespawn = P_TeleportMove(self, self->Pos(), true, false);
	}
	else
	{
		oktorespawn = P_CheckPosition(self, self->Pos(), true);
	}

	if (oktorespawn)
	{
		AActor *defs = self->GetDefault();
		self->health = defs->health;

		// [KS] Don't keep target, because it could be self if the monster committed suicide
		//      ...Actually it's better off an option, so you have better control over monster behavior.
		if (!(flags & RSF_KEEPTARGET))
		{
			self->target = NULL;
			self->LastHeard = NULL;
			self->lastenemy = NULL;
		}
		else
		{
			// Don't attack yourself (Re: "Marine targets itself after suicide")
			if (self->target == self)
				self->target = NULL;
			if (self->lastenemy == self)
				self->lastenemy = NULL;
		}

		self->flags  = (defs->flags & ~MF_FRIENDLY) | (self->flags & MF_FRIENDLY);
		self->flags2 = defs->flags2;
		self->flags3 = (defs->flags3 & ~(MF3_NOSIGHTCHECK | MF3_HUNTPLAYERS)) | (self->flags3 & (MF3_NOSIGHTCHECK | MF3_HUNTPLAYERS));
		self->flags4 = (defs->flags4 & ~MF4_NOHATEPLAYERS) | (self->flags4 & MF4_NOHATEPLAYERS);
		self->flags5 = defs->flags5;
		self->flags6 = defs->flags6;
		self->flags7 = defs->flags7;
		self->SetState (self->SpawnState);
		self->renderflags &= ~RF_INVISIBLE;

		if (flags & RSF_FOG)
		{
			P_SpawnTeleportFog(self, pos, true, true);
			P_SpawnTeleportFog(self, self->Pos(), false, true);
		}
		if (self->CountsAsKill())
		{
			level.total_monsters++;
		}
	}
	else
	{
		self->flags &= ~MF_SOLID;
	}
	return 0;
}